

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

long data_cb(cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,long nframes
            )

{
  float fVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  if (0 < nframes) {
    fVar1 = *user_ptr;
    iVar2 = *(int *)((long)user_ptr + 4);
    lVar3 = 0;
    do {
      dVar4 = sin((((double)CONCAT44(0x45300000,
                                     (int)((ulong)*(undefined8 *)((long)user_ptr + 8) >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)*(undefined8 *)((long)user_ptr + 8)) -
                  4503599627370496.0)) * (((double)fVar1 * 6.283185307179586) / (double)iVar2));
      *(long *)((long)user_ptr + 8) = *(long *)((long)user_ptr + 8) + 1;
      *(float *)((long)output_buffer + lVar3 * 4) = (float)dVar4 * 0.8;
      lVar3 = lVar3 + 1;
    } while (nframes != lVar3);
  }
  return nframes;
}

Assistant:

long
data_cb(cubeb_stream * stream, void * user_ptr, void const * input_buffer,
        void * output_buffer, long nframes)
{
  sine_wave_state * state = static_cast<sine_wave_state *>(user_ptr);
  float * out = static_cast<float *>(output_buffer);
  double phase_increment = 2.0f * M_PI * state->frequency / state->sample_rate;

  for (int i = 0; i < nframes; i++) {
    float sample = sin(phase_increment * state->count);
    state->count++;
    out[i] = sample * 0.8;
  }
  return nframes;
}